

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

void tcu::fillWithRGBAQuads(PixelBufferAccess *dst)

{
  int iVar1;
  int iVar2;
  IVec3 *pitch;
  float fVar3;
  InternalError *this;
  float fVar4;
  float fVar5;
  float fVar6;
  Vec4 local_70;
  IVec3 *local_60;
  PixelBufferAccess local_58;
  
  if ((dst->super_ConstPixelBufferAccess).m_size.m_data[2] == 1) {
    iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
    iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
    fVar4 = (float)(iVar1 / 2);
    fVar5 = (float)(iVar2 / 2);
    local_70.m_data[1] = fVar5;
    local_70.m_data[0] = fVar4;
    local_70.m_data[2] = 1.4013e-45;
    local_60 = &(dst->super_ConstPixelBufferAccess).m_pitch;
    PixelBufferAccess::PixelBufferAccess
              (&local_58,(TextureFormat *)dst,(IVec3 *)&local_70,local_60,
               (dst->super_ConstPixelBufferAccess).m_data);
    local_70.m_data[0] = 1.0;
    local_70.m_data[1] = 0.0;
    local_70.m_data[2] = 0.0;
    local_70.m_data[3] = 1.0;
    clear(&local_58,&local_70);
    pitch = local_60;
    fVar6 = (float)(iVar1 - (int)fVar4);
    local_70.m_data[1] = fVar5;
    local_70.m_data[0] = fVar6;
    local_70.m_data[2] = 1.4013e-45;
    PixelBufferAccess::PixelBufferAccess
              (&local_58,(TextureFormat *)dst,(IVec3 *)&local_70,local_60,
               (void *)((long)((dst->super_ConstPixelBufferAccess).m_pitch.m_data[0] * (int)fVar4) +
                       (long)(dst->super_ConstPixelBufferAccess).m_data));
    local_70.m_data[0] = 0.0;
    local_70.m_data[1] = 1.0;
    local_70.m_data[2] = 0.0;
    local_70.m_data[3] = 1.0;
    clear(&local_58,&local_70);
    fVar3 = (float)(iVar2 - (int)fVar5);
    local_70.m_data[1] = fVar3;
    local_70.m_data[0] = fVar4;
    local_70.m_data[2] = 1.4013e-45;
    PixelBufferAccess::PixelBufferAccess
              (&local_58,(TextureFormat *)dst,(IVec3 *)&local_70,pitch,
               (void *)((long)((dst->super_ConstPixelBufferAccess).m_pitch.m_data[1] * (int)fVar5) +
                       (long)(dst->super_ConstPixelBufferAccess).m_data));
    local_70.m_data[0] = 0.0;
    local_70.m_data[1] = 0.0;
    local_70.m_data[2] = 1.0;
    local_70.m_data[3] = 0.0;
    clear(&local_58,&local_70);
    local_70.m_data[1] = fVar3;
    local_70.m_data[0] = fVar6;
    local_70.m_data[2] = 1.4013e-45;
    PixelBufferAccess::PixelBufferAccess
              (&local_58,(TextureFormat *)dst,(IVec3 *)&local_70,local_60,
               (void *)((long)(dst->super_ConstPixelBufferAccess).m_data +
                       (long)((int)fVar5 * (dst->super_ConstPixelBufferAccess).m_pitch.m_data[1]) +
                       (long)((int)fVar4 * (dst->super_ConstPixelBufferAccess).m_pitch.m_data[0])));
    local_70.m_data[0] = 0.5;
    local_70.m_data[1] = 0.5;
    local_70.m_data[2] = 0.5;
    local_70.m_data[3] = 1.0;
    clear(&local_58,&local_70);
    return;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this,(char *)0x0,"dst.getDepth() == 1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuTextureUtil.cpp"
             ,0x3c8);
  __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

void fillWithRGBAQuads (const PixelBufferAccess& dst)
{
	TCU_CHECK_INTERNAL(dst.getDepth() == 1);
	int width	= dst.getWidth();
	int height	= dst.getHeight();
	int	left	= width/2;
	int top		= height/2;

	clear(getSubregion(dst, 0,		0,		0, left,		top,		1),	Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	clear(getSubregion(dst, left,	0,		0, width-left,	top,		1),	Vec4(0.0f, 1.0f, 0.0f, 1.0f));
	clear(getSubregion(dst, 0,		top,	0, left,		height-top,	1), Vec4(0.0f, 0.0f, 1.0f, 0.0f));
	clear(getSubregion(dst, left,	top,	0, width-left,	height-top, 1), Vec4(0.5f, 0.5f, 0.5f, 1.0f));
}